

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldd2bdd.c
# Opt level: O0

void parse_args(int argc,char **argv)

{
  undefined4 local_20;
  int local_1c;
  int long_index;
  int key;
  char **argv_local;
  int argc_local;
  
  local_1c = 0;
  local_20 = 0;
  _long_index = argv;
  argv_local._4_4_ = argc;
  while( true ) {
    while( true ) {
      while( true ) {
        local_1c = getopt_long(argv_local._4_4_,_long_index,"w:vh",parse_args::longopts,&local_20);
        if (local_1c == -1) {
          if (_optind + 1 < argv_local._4_4_) {
            model_filename = _long_index[_optind];
            bdd_filename = _long_index[_optind + 1];
            return;
          }
          print_usage();
          exit(0);
        }
        if (local_1c != 1) break;
        no_reachable = 1;
      }
      if (local_1c != 2) break;
      check_results = 1;
    }
    if (local_1c == 99) break;
    if (local_1c == 0x68) {
      print_help();
      exit(0);
    }
    if (local_1c == 0x76) {
      verbose = 1;
    }
    else if (local_1c == 0x77) {
      workers = atoi(_optarg);
    }
  }
  print_usage();
  exit(0);
}

Assistant:

static void
parse_args(int argc, char **argv)
{
    static const struct option longopts[] = {
        {.name = "workers", .val = 'w', .has_arg = required_argument},
        {.name = "check-results", .val = 2, .has_arg = no_argument},
        {.name = "no-reachable", .val = 1, .has_arg = no_argument},
        {.name = "verbose", .val = 'v', .has_arg = no_argument},
        {.name = "help", .val = 'h', .has_arg = no_argument},
        {.name = "usage", .val = 99, .has_arg = no_argument},
        {}
    };
    int key = 0;
    int long_index = 0;
    while ((key = getopt_long(argc, argv, "w:vh", longopts, &long_index)) != -1) {
        switch (key) {
            case 'w':
                workers = atoi(optarg);
                break;
            case 'v':
                verbose = 1;
                break;
            case 1:
                no_reachable = 1;
                break;
            case 2:
                check_results = 1;
                break;
            case 99:
                print_usage();
                exit(0);
            case 'h':
                print_help();
                exit(0);
        }
    }
    if (optind + 1 >= argc) {
        print_usage();
        exit(0);
    }
    model_filename = argv[optind];
    bdd_filename = argv[optind + 1];
}